

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O0

void __thiscall
booster::streambuf::device
          (streambuf *this,
          unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *d)

{
  pointer piVar1;
  streambuf *in_RSI;
  long in_RDI;
  unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>
  *in_stack_ffffffffffffffd8;
  
  reset_device(in_RSI);
  std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::operator=
            ((unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *)in_RSI,
             in_stack_ffffffffffffffd8);
  piVar1 = std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::get
                     ((unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *)
                      in_RSI);
  *(pointer *)(in_RDI + 0x88) = piVar1;
  return;
}

Assistant:

void streambuf::device(std::unique_ptr<io_device> d)
	{
		reset_device();
		device_unique_ptr_=std::move(d);
		device_ = device_unique_ptr_.get();
	}